

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O0

void __thiscall
NaPNStatistics::configure_output(NaPNStatistics *this,char *szStatMask,char *szDelim)

{
  long lVar1;
  char *pcVar2;
  char *__delim;
  size_t sVar3;
  undefined8 uStack_50;
  char acStack_48 [4];
  int iStack_44;
  NaPNStatistics *local_40;
  int local_38;
  uint local_34;
  int id;
  int resmask;
  char *statmask;
  char *token;
  char *szDelim_local;
  char *szStatMask_local;
  NaPNStatistics *this_local;
  
  if ((szStatMask != (char *)0x0) && (szDelim != (char *)0x0)) {
    uStack_50 = 0x15097a;
    local_40 = this;
    token = szDelim;
    szDelim_local = szStatMask;
    szStatMask_local = (char *)this;
    sVar3 = strlen(szStatMask);
    pcVar2 = szDelim_local;
    lVar1 = -(sVar3 + 0x10 & 0xfffffffffffffff0);
    local_34 = 0;
    _id = acStack_48 + lVar1;
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1509a6;
    strcpy(acStack_48 + lVar1,pcVar2);
    __delim = token;
    pcVar2 = _id;
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1509b3;
    statmask = strtok(pcVar2,__delim);
    while (statmask != (char *)0x0) {
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1509c8;
      local_38 = NaStatTextToId(*(char **)(&stack0x00000008 + lVar1));
      pcVar2 = token;
      if (local_38 != -1) {
        local_34 = 1 << ((byte)local_38 & 0x1f) | local_34;
      }
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x1509f0;
      statmask = strtok((char *)0x0,pcVar2);
    }
    if (local_34 != 0) {
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x150a09;
      configure_output(*(NaPNStatistics **)((long)&local_40 + lVar1),
                       *(int *)((long)&iStack_44 + lVar1));
    }
  }
  return;
}

Assistant:

void
NaPNStatistics::configure_output (const char* szStatMask, const char* szDelim)
{
    if(NULL == szStatMask || NULL == szDelim)
	return;

    char *token, *statmask = (char*)alloca(strlen(szStatMask) + 1);
    int resmask = 0;

    strcpy(statmask, szStatMask);

    for(token = strtok(statmask, szDelim); NULL != token;
	token = strtok(NULL, szDelim))
	{
	    int	id = NaStatTextToId(token);

	    if(id != NaSI_bad_id)
		resmask |= NaSIdToMask(id);
	}
    if(0 != resmask)
	configure_output(resmask);
}